

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank.cc
# Opt level: O3

void __thiscall rank::Rank::add(Rank *this,KeyValue *kv)

{
  Value *pVVar1;
  Key key;
  iterator __position;
  long lVar2;
  Entry *pEVar3;
  ulong uVar4;
  pointer pEVar5;
  pointer pEVar6;
  Entry local_40;
  
  key = kv->_key;
  pEVar3 = find(this,key);
  if (pEVar3 == (Entry *)0x0) {
    local_40._key_value._value = kv->_value;
    local_40._order = 0;
    __position._M_current =
         (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_40._key_value._key = key;
    if (__position._M_current ==
        (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<rank::Entry,_std::allocator<rank::Entry>_>::_M_realloc_insert<rank::Entry>
                (&this->_entries,__position,&local_40);
      pEVar5 = (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (__position._M_current)->_order = 0;
      local_40._key_value._key._0_4_ = (undefined4)key;
      local_40._key_value._key._4_4_ = (undefined4)(key >> 0x20);
      local_40._key_value._value._4_4_ = (undefined4)(local_40._key_value._value >> 0x20);
      *(undefined4 *)&((__position._M_current)->_key_value)._key =
           (undefined4)local_40._key_value._key;
      *(undefined4 *)((long)&((__position._M_current)->_key_value)._key + 4) =
           local_40._key_value._key._4_4_;
      *(undefined4 *)&((__position._M_current)->_key_value)._value =
           (undefined4)local_40._key_value._value;
      *(undefined4 *)((long)&((__position._M_current)->_key_value)._value + 4) =
           local_40._key_value._value._4_4_;
      pEVar5 = (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
      (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
      super__Vector_impl_data._M_finish = pEVar5;
    }
    pEVar6 = (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pEVar6 == pEVar5) goto LAB_001084a9;
    uVar4 = ((long)pEVar5 - (long)pEVar6 >> 3) * -0x5555555555555555;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<rank::Entry*,std::vector<rank::Entry,std::allocator<rank::Entry>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar6,pEVar5,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
  }
  else {
    pVVar1 = &(pEVar3->_key_value)._value;
    *pVVar1 = *pVVar1 + kv->_value;
    pEVar6 = (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
             super__Vector_impl_data._M_start;
    pEVar5 = (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pEVar6 == pEVar5) goto LAB_001084a9;
    uVar4 = ((long)pEVar5 - (long)pEVar6 >> 3) * -0x5555555555555555;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<rank::Entry*,std::vector<rank::Entry,std::allocator<rank::Entry>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar6,pEVar5,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
  }
  std::
  __final_insertion_sort<__gnu_cxx::__normal_iterator<rank::Entry*,std::vector<rank::Entry,std::allocator<rank::Entry>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (pEVar6,pEVar5);
LAB_001084a9:
  this->_dirty = true;
  return;
}

Assistant:

void Rank::add(const KeyValue& kv) {
        auto r = find(kv.key());
        if (!r) {
            _entries.push_back(Entry{kv});
            std::sort(_entries.begin(),_entries.end());
            _dirty = true;
        }
        else {
            r->key_value().value_add(kv.value());
            std::sort(_entries.begin(),_entries.end());
            _dirty = true;
        }
    }